

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

matrix<double> * __thiscall
mat_lib::matrix<double>::operator-=(matrix<double> *this,matrix<double> *m)

{
  size_t sVar1;
  size_t sVar2;
  element_t *peVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  element_t *peVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ostringstream str_stream;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  sVar1 = this->rows__;
  if ((sVar1 == m->rows__) && (sVar2 = this->columns__, sVar2 == m->columns__)) {
    if (sVar1 != 0) {
      peVar5 = m->elements__;
      peVar3 = this->elements__;
      sVar7 = 0;
      do {
        if (sVar2 != 0) {
          lVar6 = 0;
          sVar8 = 0;
          do {
            *(double *)((long)peVar3 + (lVar6 >> 0x1d) + sVar7 * sVar2 * 8) =
                 *(double *)((long)peVar3 + (lVar6 >> 0x1d) + sVar7 * sVar2 * 8) - peVar5[sVar8];
            sVar8 = sVar8 + 1;
            lVar6 = lVar6 + 0x100000000;
          } while (sVar2 != sVar8);
        }
        sVar7 = sVar7 + 1;
        peVar5 = peVar5 + sVar2;
      } while (sVar7 != sVar1);
    }
    return this;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"size mismatch! cannot substract matrices (",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"operator-=",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"() in ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_198,0x172);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t columns() const { return columns__; }